

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

void rcg::getColor(uint8_t *rgb,shared_ptr<const_rcg::Image> *img,uint32_t ds,uint32_t i,uint32_t k)

{
  element_type *peVar1;
  uint64_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint32_t kk_1;
  uint8_t *puVar14;
  uint8_t v_1 [3];
  uint8_t v [3];
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint8_t *local_40;
  long local_38;
  
  local_4c = ds + (ds == 0);
  local_48 = (ulong)(i * local_4c);
  uVar12 = (ulong)(k * local_4c);
  peVar1 = (img->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = peVar1->pixelformat;
  local_40 = rgb;
  if ((long)uVar2 < 0x2100032) {
    if (uVar2 == 0x1080001) {
      lVar6 = peVar1->xpadding + peVar1->width;
      lVar7 = local_48 +
              uVar12 * lVar6 +
              (long)(peVar1->pixel)._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
      uVar13 = 0;
      uVar5 = 0;
      do {
        uVar12 = 0;
        do {
          uVar5 = uVar5 + *(byte *)(lVar7 + uVar12);
          uVar12 = uVar12 + 1;
        } while (local_4c != uVar12);
        lVar7 = lVar7 + lVar6;
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_4c);
      uVar3 = (uint8_t)(uVar5 / (local_4c * local_4c));
      *rgb = uVar3;
      rgb[1] = uVar3;
      goto LAB_00123297;
    }
    if (uVar2 != 0x20c005a) {
      return;
    }
    local_38 = (peVar1->width >> 2) * 6 + peVar1->xpadding;
    puVar14 = (uint8_t *)
              (uVar12 * local_38 +
              (long)(peVar1->pixel)._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
    ;
    local_54 = 0;
    uVar5 = 0;
    local_50 = 0;
    uVar13 = 0;
    do {
      uVar12 = local_48 & 0xffffffff;
      uVar4 = local_4c;
      do {
        convYCbCr411toRGB(&local_57,puVar14,(int)uVar12);
        uVar13 = uVar13 + local_57;
        local_50 = local_50 + local_56;
        uVar5 = uVar5 + local_55;
        uVar12 = (ulong)((int)uVar12 + 1);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      puVar14 = puVar14 + local_38;
      local_54 = local_54 + 1;
    } while (local_54 != local_4c);
LAB_00123273:
    local_4c = local_4c * local_4c;
    *local_40 = (uint8_t)(uVar13 / local_4c);
    local_40[1] = (uint8_t)(local_50 / local_4c);
    rgb = local_40;
  }
  else {
    if ((uVar2 == 0x2100032) || (uVar2 == 0x210003b)) {
      local_38 = (peVar1->width * 2 & 0xfffffffffffffff8) + peVar1->xpadding;
      puVar14 = (uint8_t *)
                (uVar12 * local_38 +
                (long)(peVar1->pixel)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                );
      local_54 = 0;
      uVar5 = 0;
      local_50 = 0;
      uVar13 = 0;
      do {
        uVar12 = local_48 & 0xffffffff;
        uVar4 = local_4c;
        do {
          convYCbCr422toRGB(&local_5a,puVar14,(int)uVar12);
          uVar13 = uVar13 + local_5a;
          local_50 = local_50 + local_59;
          uVar5 = uVar5 + local_58;
          uVar12 = (ulong)((int)uVar12 + 1);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
        puVar14 = puVar14 + local_38;
        local_54 = local_54 + 1;
      } while (local_54 != local_4c);
      goto LAB_00123273;
    }
    if (uVar2 != 0x2180014) {
      return;
    }
    lVar6 = peVar1->width * 3 + peVar1->xpadding;
    pbVar8 = (byte *)((ulong)(i * local_4c * 3) +
                     uVar12 * lVar6 +
                     (long)(peVar1->pixel)._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                     );
    uVar11 = 0;
    uVar5 = 0;
    uVar10 = 0;
    uVar4 = 0;
    uVar13 = local_4c;
    pbVar9 = pbVar8;
    do {
      do {
        uVar4 = uVar4 + *pbVar8;
        uVar10 = uVar10 + pbVar8[1];
        uVar5 = uVar5 + pbVar8[2];
        pbVar8 = pbVar8 + 3;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      pbVar8 = pbVar9 + lVar6;
      uVar11 = uVar11 + 1;
      uVar13 = local_4c;
      pbVar9 = pbVar8;
    } while (uVar11 != local_4c);
    local_4c = local_4c * local_4c;
    *rgb = (uint8_t)(uVar4 / local_4c);
    rgb[1] = (uint8_t)(uVar10 / local_4c);
  }
  uVar3 = (uint8_t)(uVar5 / local_4c);
LAB_00123297:
  rgb[2] = uVar3;
  return;
}

Assistant:

void getColor(uint8_t rgb[3], const std::shared_ptr<const Image> &img,
              uint32_t ds, uint32_t i, uint32_t k)
{
  if (ds < 1)
    ds = 1;

  i*=ds;
  k*=ds;

  if (img->getPixelFormat() == Mono8) // convert from monochrome
  {
    size_t lstep=img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+i;

    uint32_t g=0, n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        g+=p[ii];
        n++;
      }

      p+=lstep;
    }

    rgb[2]=rgb[1]=rgb[0]=static_cast<uint8_t>(g/n);
  }
  else if (img->getPixelFormat() == RGB8) // convert from RGB8
  {
    size_t lstep=3*img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+3*i;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      const uint8_t *pp=p;
      for (uint32_t ii=0; ii<ds; ii++)
      {
        r+=*pp++;
        g+=*pp++;
        b+=*pp++;
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr411_8) // convert from YUV411
  {
    size_t lstep=(img->getWidth()>>2)*6+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr411toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr422_8 || img->getPixelFormat() == YUV422_8) // convert from YUV422
  {
    size_t lstep=(img->getWidth()>>2)*8+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr422toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
}